

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

RandomBernoulliLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randombernoullilike(NeuralNetworkLayer *this)

{
  RandomBernoulliLikeLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x4ba) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4ba;
    this_00 = (RandomBernoulliLikeLayerParams *)operator_new(0x20);
    RandomBernoulliLikeLayerParams::RandomBernoulliLikeLayerParams(this_00);
    (this->layer_).randombernoullilike_ = this_00;
  }
  return (RandomBernoulliLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomBernoulliLikeLayerParams* NeuralNetworkLayer::mutable_randombernoullilike() {
  if (!has_randombernoullilike()) {
    clear_layer();
    set_has_randombernoullilike();
    layer_.randombernoullilike_ = new ::CoreML::Specification::RandomBernoulliLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomBernoulliLike)
  return layer_.randombernoullilike_;
}